

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::FOREACH_OP(SQVM *this,SQObjectPtr *o1,SQObjectPtr *o2,SQObjectPtr *o3,SQObjectPtr *o4,
                SQInteger arg_2,int exitpos,int *jump)

{
  SQObjectType SVar1;
  SQGeneratorState SVar2;
  SQTable *pSVar3;
  bool bVar4;
  int iVar5;
  long x;
  SQObjectPtr *obj;
  SQChar *pSVar6;
  SQMetaMethod mm;
  SQInteger x_00;
  char *s;
  SQObjectPtr itr;
  SQObjectPtr closure;
  
  SVar1 = (o1->super_SQObject)._type;
  if (SVar1 == OT_STRING) {
    x = SQString::Next((o1->super_SQObject)._unVal.pString,o4,o2,o3);
  }
  else if (SVar1 == OT_ARRAY) {
    x = SQArray::Next((o1->super_SQObject)._unVal.pArray,o4,o2,o3);
  }
  else {
    if (SVar1 == OT_GENERATOR) {
      SVar2 = ((o1->super_SQObject)._unVal.pGenerator)->_state;
      if (SVar2 == eSuspended) {
        x_00 = 0;
        if ((o4->super_SQObject)._type == OT_INTEGER) {
          x_00 = (o4->super_SQObject)._unVal.nInteger + 1;
        }
        SQObjectPtr::operator=(o2,x_00);
        SQObjectPtr::operator=(o4,x_00);
        SQGenerator::Resume((o1->super_SQObject)._unVal.pGenerator,this,o3);
        *jump = 0;
        return true;
      }
      if (SVar2 != eDead) {
LAB_0012b009:
        pSVar6 = GetTypeName(o1);
        Raise_Error(this,"cannot iterate %s",pSVar6);
        return false;
      }
      goto LAB_0012b05d;
    }
    if (SVar1 == OT_CLASS) {
      x = SQClass::Next((o1->super_SQObject)._unVal.pClass,o4,o2,o3);
    }
    else {
      if ((SVar1 == OT_INSTANCE) || (SVar1 == OT_USERDATA)) {
        pSVar3 = (o1->super_SQObject)._unVal.pTable;
        if ((pSVar3->super_SQDelegable)._delegate == (SQTable *)0x0) {
          return false;
        }
        itr.super_SQObject._type = OT_NULL;
        itr.super_SQObject._unVal.pTable = (SQTable *)0x0;
        closure.super_SQObject._type = OT_NULL;
        closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
        iVar5 = (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                  _vptr_SQRefCounted[6])(pSVar3,this,9);
        if ((char)iVar5 == '\0') {
          s = "_nexti failed";
LAB_0012b074:
          bVar4 = false;
          Raise_Error(this,s);
        }
        else {
          Push(this,o1);
          Push(this,o4);
          bVar4 = CallMetaMethod(this,&closure,mm,2,&itr);
          if (!bVar4) {
            bVar4 = false;
            goto LAB_0012b0c8;
          }
          obj = SQObjectPtr::operator=(o2,&itr);
          SQObjectPtr::operator=(o4,obj);
          if (itr.super_SQObject._type != OT_NULL) {
            bVar4 = Get(this,o1,&itr,o3,0,0x29a);
            if (!bVar4) {
              s = "_nexti returned an invalid idx";
              goto LAB_0012b074;
            }
            exitpos = 1;
          }
          *jump = exitpos;
          bVar4 = true;
        }
LAB_0012b0c8:
        SQObjectPtr::~SQObjectPtr(&closure);
        SQObjectPtr::~SQObjectPtr(&itr);
        return bVar4;
      }
      if (SVar1 != OT_TABLE) goto LAB_0012b009;
      x = SQTable::Next((o1->super_SQObject)._unVal.pTable,false,o4,o2,o3);
    }
  }
  if (x != -1) {
    SQObjectPtr::operator=(o4,x);
    *jump = 1;
    return true;
  }
LAB_0012b05d:
  *jump = exitpos;
  return true;
}

Assistant:

bool SQVM::FOREACH_OP(SQObjectPtr &o1,SQObjectPtr &o2,SQObjectPtr
&o3,SQObjectPtr &o4,SQInteger SQ_UNUSED_ARG(arg_2),int exitpos,int &jump)
{
    SQInteger nrefidx;
    switch(sq_type(o1)) {
    case OT_TABLE:
        if((nrefidx = _table(o1)->Next(false,o4, o2, o3)) == -1) _FINISH(exitpos);
        o4 = (SQInteger)nrefidx; _FINISH(1);
    case OT_ARRAY:
        if((nrefidx = _array(o1)->Next(o4, o2, o3)) == -1) _FINISH(exitpos);
        o4 = (SQInteger) nrefidx; _FINISH(1);
    case OT_STRING:
        if((nrefidx = _string(o1)->Next(o4, o2, o3)) == -1)_FINISH(exitpos);
        o4 = (SQInteger)nrefidx; _FINISH(1);
    case OT_CLASS:
        if((nrefidx = _class(o1)->Next(o4, o2, o3)) == -1)_FINISH(exitpos);
        o4 = (SQInteger)nrefidx; _FINISH(1);
    case OT_USERDATA:
    case OT_INSTANCE:
        if(_delegable(o1)->_delegate) {
            SQObjectPtr itr;
            SQObjectPtr closure;
            if(_delegable(o1)->GetMetaMethod(this, MT_NEXTI, closure)) {
                Push(o1);
                Push(o4);
                if(CallMetaMethod(closure, MT_NEXTI, 2, itr)) {
                    o4 = o2 = itr;
                    if(sq_type(itr) == OT_NULL) _FINISH(exitpos);
                    if(!Get(o1, itr, o3, 0, DONT_FALL_BACK)) {
                        Raise_Error(_SC("_nexti returned an invalid idx")); // cloud be changed
                        return false;
                    }
                    _FINISH(1);
                }
                else {
                    return false;
                }
            }
            Raise_Error(_SC("_nexti failed"));
            return false;
        }
        break;
    case OT_GENERATOR:
        if(_generator(o1)->_state == SQGenerator::eDead) _FINISH(exitpos);
        if(_generator(o1)->_state == SQGenerator::eSuspended) {
            SQInteger idx = 0;
            if(sq_type(o4) == OT_INTEGER) {
                idx = _integer(o4) + 1;
            }
            o2 = idx;
            o4 = idx;
            _generator(o1)->Resume(this, o3);
            _FINISH(0);
        }
    default:
        Raise_Error(_SC("cannot iterate %s"), GetTypeName(o1));
    }
    return false; //cannot be hit(just to avoid warnings)
}